

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str,StringRef *matcherString)

{
  StringMatcher local_90;
  long *local_58;
  long local_48 [2];
  long *local_38;
  long local_28 [2];
  
  Matchers::Equals((EqualsMatcher *)&local_90,str,Yes);
  handleExceptionMatchExpr(handler,&local_90,matcherString);
  local_90.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_00198ff0;
  local_90.
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_00199018;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_90.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_00198ef0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p !=
      &local_90.super_MatcherUntypedBase.m_cachedToString.field_2) {
    operator_delete(local_90.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p,
                    local_90.super_MatcherUntypedBase.m_cachedToString.field_2._M_allocated_capacity
                    + 1);
  }
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, std::string const& str, StringRef const& matcherString  ) {
        handleExceptionMatchExpr( handler, Matchers::Equals( str ), matcherString );
    }